

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O3

void __thiscall
WordSplitStringTest_random_vector_Test<wchar_t>::TestBody
          (WordSplitStringTest_random_vector_Test<wchar_t> *this)

{
  char *pcVar1;
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  split_result;
  RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> data;
  AssertHelper local_b0 [8];
  long *local_a8;
  internal local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  container_type_conflict9 local_90;
  RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> local_78;
  
  RandomWordTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::RandomWordTestData
            (&local_78,L'\0',0,0);
  jessilib::
  word_split<std::vector,_std::vector<wchar_t,_std::allocator<wchar_t>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
            (&local_90,
             (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_finish,L'\0');
  testing::internal::
  CmpHelperEQ<std::vector<std::vector<wchar_t,std::allocator<wchar_t>>,std::allocator<std::vector<wchar_t,std::allocator<wchar_t>>>>,std::vector<std::vector<wchar_t,std::allocator<wchar_t>>,std::allocator<std::vector<wchar_t,std::allocator<wchar_t>>>>>
            (local_a0,"split_result","data.m_tokens",&local_90,&local_78.m_tokens);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xf7,pcVar1);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_a8 != (long *)0x0) {
      (**(code **)(*local_a8 + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_90);
  if (local_78.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_78.m_tokens);
  if (local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_start != (wchar_t *)0x0) {
    operator_delete(local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_delim.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random_vector) {
	RandomWordTestData<TypeParam, std::vector<TypeParam>> data{};
	std::vector<std::vector<TypeParam>> split_result = word_split<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>);
	EXPECT_EQ(split_result, data.m_tokens);
}